

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto_ReservedRange::InternalSwap
          (DescriptorProto_ReservedRange *this,DescriptorProto_ReservedRange *other)

{
  InternalMetadataWithArena *this_00;
  int32 iVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  UnknownFieldSet *pUVar6;
  UnknownFieldSet *pUVar7;
  
  iVar1 = this->start_;
  this->start_ = other->start_;
  other->start_ = iVar1;
  iVar1 = this->end_;
  this->end_ = other->end_;
  other->end_ = iVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar4 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar7 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar7 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    pvVar4 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar6 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar6 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    pvVar5 = pUVar6->fields_;
    pUVar6->fields_ = pUVar7->fields_;
    pUVar7->fields_ = pvVar5;
  }
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void DescriptorProto_ReservedRange::InternalSwap(DescriptorProto_ReservedRange* other) {
  std::swap(start_, other->start_);
  std::swap(end_, other->end_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}